

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1072::run(TestCase1072 *this)

{
  word **ppwVar1;
  uchar *puVar2;
  size_t sVar3;
  uchar *puVar4;
  __off_t __length;
  BuilderFor<capnp::Data> BVar5;
  ReaderFor<capnp::Data> RVar6;
  ArrayPtr<const_unsigned_char> AVar7;
  ArrayPtr<const_unsigned_char> local_210;
  int local_200;
  bool local_1f9;
  undefined1 auStack_1f8 [7];
  bool _kj_shouldLog_5;
  size_t local_1f0;
  int local_1e8;
  bool local_1e1;
  uint local_1e0;
  int iStack_1dc;
  bool _kj_shouldLog_4;
  uint i_1;
  int local_1d4;
  bool _kj_shouldLog_3;
  uint local_1cc;
  bool _kj_shouldLog_2;
  uchar *puStack_1c8;
  uint i;
  uchar *local_1c0;
  bool local_1b1;
  size_t sStack_1b0;
  bool _kj_shouldLog_1;
  int local_1a8;
  bool local_1a1;
  undefined1 auStack_1a0 [7];
  bool _kj_shouldLog;
  ReaderFor<capnp::Data> reader;
  Orphanage local_180;
  undefined1 local_170 [8];
  Orphan<capnp::Data> orphan2;
  BuilderFor<capnp::Data> builder;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder message;
  TestCase1072 *this_local;
  
  ppwVar1 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)ppwVar1,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)ppwVar1);
  Orphanage::newOrphan<capnp::Data>((Orphan<capnp::Data> *)local_120,&local_130,0x11);
  BVar5 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_120);
  orphan2.builder.location = (word *)BVar5.super_ArrayPtr<unsigned_char>.ptr;
  ppwVar1 = &orphan2.builder.location;
  puVar2 = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)ppwVar1);
  sVar3 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)ppwVar1);
  memset(puVar2,0x7b,sVar3);
  local_180 = MessageBuilder::getOrphanage((MessageBuilder *)&orphan.builder.location);
  Orphanage::newOrphan<capnp::Data>((Orphan<capnp::Data> *)local_170,&local_180,1);
  BVar5 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_170);
  reader.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)BVar5.super_ArrayPtr<unsigned_char>.ptr
  ;
  puVar2 = kj::ArrayPtr<unsigned_char>::operator[]
                     ((ArrayPtr<unsigned_char> *)&reader.super_ArrayPtr<const_unsigned_char>.size_,0
                     );
  *puVar2 = ' ';
  Orphan<capnp::Data>::truncate((Orphan<capnp::Data> *)local_120,(char *)0x1b,__length);
  RVar6 = Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_120);
  reader.super_ArrayPtr<const_unsigned_char>.ptr =
       (uchar *)RVar6.super_ArrayPtr<const_unsigned_char>.size_;
  _auStack_1a0 = RVar6.super_ArrayPtr<const_unsigned_char>.ptr;
  sVar3 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_1a0);
  if (sVar3 != 0x1b) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      local_1a8 = 0x1b;
      sStack_1b0 = kj::ArrayPtr<const_unsigned_char>::size
                             ((ArrayPtr<const_unsigned_char> *)auStack_1a0);
      kj::_::Debug::log<char_const(&)[41],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x43c,ERROR,"\"failed: expected \" \"(27) == (reader.size())\", 27, reader.size()"
                 ,(char (*) [41])"failed: expected (27) == (reader.size())",&local_1a8,
                 &stack0xfffffffffffffe50);
      local_1a1 = false;
    }
  }
  puVar2 = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&orphan2.builder.location);
  puVar4 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)auStack_1a0);
  if (puVar2 == puVar4) {
    local_1b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      local_1c0 = kj::ArrayPtr<unsigned_char>::begin
                            ((ArrayPtr<unsigned_char> *)&orphan2.builder.location);
      puStack_1c8 = kj::ArrayPtr<const_unsigned_char>::begin
                              ((ArrayPtr<const_unsigned_char> *)auStack_1a0);
      kj::_::Debug::log<char_const(&)[55],unsigned_char*,unsigned_char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x43d,ERROR,
                 "\"failed: expected \" \"(builder.begin()) != (reader.begin())\", builder.begin(), reader.begin()"
                 ,(char (*) [55])"failed: expected (builder.begin()) != (reader.begin())",&local_1c0
                 ,&stack0xfffffffffffffe38);
      local_1b1 = false;
    }
  }
  for (local_1cc = 0; local_1cc < 0x11; local_1cc = local_1cc + 1) {
    puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)auStack_1a0,(ulong)local_1cc);
    if (*puVar2 != '{') {
      _kj_shouldLog_3 = kj::_::Debug::shouldLog(ERROR);
      while (_kj_shouldLog_3 != false) {
        local_1d4 = 0x7b;
        puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)auStack_1a0,(ulong)local_1cc);
        kj::_::Debug::log<char_const(&)[38],int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x440,ERROR,"\"failed: expected \" \"(123) == (reader[i])\", 123, reader[i]",
                   (char (*) [38])"failed: expected (123) == (reader[i])",&local_1d4,puVar2);
        _kj_shouldLog_3 = false;
      }
    }
    puVar2 = kj::ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&orphan2.builder.location,(ulong)local_1cc);
    if (*puVar2 != '\0') {
      i_1._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)i_1._3_1_ != false) {
        iStack_1dc = 0;
        puVar2 = kj::ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&orphan2.builder.location,(ulong)local_1cc);
        kj::_::Debug::log<char_const(&)[37],int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x441,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                   (char (*) [37])"failed: expected (0) == (builder[i])",&stack0xfffffffffffffe24,
                   puVar2);
        i_1._3_1_ = false;
      }
    }
  }
  for (local_1e0 = 0x11; local_1e0 < 0x1b; local_1e0 = local_1e0 + 1) {
    puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)auStack_1a0,(ulong)local_1e0);
    if (*puVar2 != '\0') {
      local_1e1 = kj::_::Debug::shouldLog(ERROR);
      while (local_1e1 != false) {
        local_1e8 = 0;
        puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)auStack_1a0,(ulong)local_1e0);
        kj::_::Debug::log<char_const(&)[36],int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x444,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                   (char (*) [36])"failed: expected (0) == (reader[i])",&local_1e8,puVar2);
        local_1e1 = false;
      }
    }
  }
  _auStack_1f8 = (ArrayPtr<const_unsigned_char>)
                 Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_170);
  puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                     ((ArrayPtr<const_unsigned_char> *)auStack_1f8,0);
  if (*puVar2 != ' ') {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      local_200 = 0x20;
      AVar7 = (ArrayPtr<const_unsigned_char>)
              Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_170);
      local_210 = AVar7;
      puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[](&local_210,0);
      kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x447,ERROR,
                 "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
                 ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",&local_200,
                 puVar2);
      local_1f9 = false;
    }
  }
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_170);
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, ExtendDataCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Data>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 123, builder.size());

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(27);

  auto reader = orphan.getReader();
  EXPECT_EQ(27, reader.size());
  EXPECT_NE(builder.begin(), reader.begin());

  for (uint i = 0; i < 17; i++) {
    EXPECT_EQ(123, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 17; i < 27; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  EXPECT_EQ(32, orphan2.getReader()[0]);
}